

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_qa.cpp
# Opt level: O0

void dxil_spv::build_ssbo_store
               (Builder *builder,Id value_type,Id ssbo_id,uint32_t member,Id value_id)

{
  Id IVar1;
  pointer pIVar2;
  pointer this;
  Block *pBVar3;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_58;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_50;
  undefined4 local_44;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40;
  __single_object store;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_30;
  __single_object chain;
  Id ptr_id;
  Id value_id_local;
  uint32_t member_local;
  Id ssbo_id_local;
  Id value_type_local;
  Builder *builder_local;
  
  chain._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
       spv::Builder::makePointer(builder,StorageClassStorageBuffer,value_type);
  store._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._4_4_ =
       spv::Builder::getUniqueId(builder);
  store._M_t.super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
  super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
  super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl._0_4_ = 0x41;
  std::make_unique<spv::Instruction,unsigned_int,unsigned_int&,spv::Op>
            ((uint *)&local_30,
             (uint *)((long)&store._M_t.
                             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                             .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4),
             (Op *)((long)&chain._M_t.
                           super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>
                           .super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl + 4));
  pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_30);
  spv::Instruction::addIdOperand(pIVar2,ssbo_id);
  pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_30);
  IVar1 = spv::Builder::makeUintConstant(builder,member,false);
  spv::Instruction::addIdOperand(pIVar2,IVar1);
  local_44 = 0x3e;
  std::make_unique<spv::Instruction,spv::Op>((Op *)&local_40);
  pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_40);
  this = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                   (&local_30);
  IVar1 = spv::Instruction::getResultId(this);
  spv::Instruction::addIdOperand(pIVar2,IVar1);
  pIVar2 = std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::operator->
                     (&local_40);
  spv::Instruction::addIdOperand(pIVar2,value_id);
  pBVar3 = spv::Builder::getBuildPoint(builder);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            (&local_50,&local_30);
  spv::Block::addInstruction(pBVar3,&local_50);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_50);
  pBVar3 = spv::Builder::getBuildPoint(builder);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::unique_ptr
            (&local_58,&local_40);
  spv::Block::addInstruction(pBVar3,&local_58);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_58);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_40);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_30);
  return;
}

Assistant:

static void build_ssbo_store(spv::Builder &builder, spv::Id value_type, spv::Id ssbo_id, uint32_t member, spv::Id value_id)
{
	spv::Id ptr_id = builder.makePointer(spv::StorageClassStorageBuffer, value_type);
	auto chain = std::make_unique<spv::Instruction>(builder.getUniqueId(), ptr_id, spv::OpAccessChain);
	chain->addIdOperand(ssbo_id);
	chain->addIdOperand(builder.makeUintConstant(member));

	auto store = std::make_unique<spv::Instruction>(spv::OpStore);
	store->addIdOperand(chain->getResultId());
	store->addIdOperand(value_id);

	builder.getBuildPoint()->addInstruction(std::move(chain));
	builder.getBuildPoint()->addInstruction(std::move(store));
}